

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O3

char * monster_test_local_MyGame_Example_json_parser_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_type,uint64_t *value,
                 int *aggregate)

{
  ulong *puVar1;
  size_t n;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  
  uVar2 = (long)end - (long)buf;
  if (uVar2 < 8) {
    uVar4 = 0;
    switch(uVar2) {
    case 7:
      uVar4 = (long)buf[6] << 8;
    case 6:
      uVar4 = uVar4 | (long)buf[5] << 0x10;
    case 5:
      uVar4 = uVar4 | (long)buf[4] << 0x18;
    case 4:
      uVar4 = uVar4 | (long)buf[3] << 0x20;
    case 3:
      uVar4 = uVar4 | (long)buf[2] << 0x28;
    case 2:
      uVar4 = uVar4 | (long)buf[1] << 0x30;
    case 1:
      uVar4 = (ulong)(byte)*buf << 0x38 | uVar4;
      break;
    default:
      goto switchD_0010d546_default;
    }
  }
  else {
    uVar4 = *(ulong *)buf;
    uVar4 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
            (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
            (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  }
  if (uVar4 < 0x6865785f656e756d) {
    if (uVar4 < 0x436f6c6f72000000) {
      if (((3 < (long)uVar2) && ((uVar4 & 0x7fffff0000000000) == 0x416e790000000000)) &&
         (buf[3] == '.')) {
        pcVar3 = MyGame_Example_Any_parse_json_enum(ctx,buf + 4,end,value_type,value,aggregate);
        return pcVar3;
      }
    }
    else if ((uVar4 & 0x7fffff0000000000) == 0x466f6f0000000000) {
      if ((3 < (long)uVar2) && (buf[3] == '.')) {
        pcVar3 = MyGame_Example_Foo_parse_json_enum(ctx,buf + 4,end,value_type,value,aggregate);
        return pcVar3;
      }
    }
    else if (((5 < (long)uVar2) && ((uVar4 & 0x7fffffffff000000) == 0x436f6c6f72000000)) &&
            (buf[5] == '.')) {
      pcVar3 = MyGame_Example_Color_parse_json_enum(ctx,buf + 6,end,value_type,value,aggregate);
      return pcVar3;
    }
  }
  else if (uVar4 < 0x696e745f656e756d) {
    if (((8 < (long)uVar2) && (uVar4 == 0x6865785f656e756d)) && (buf[8] == '.')) {
      pcVar3 = MyGame_Example_hex_enum_parse_json_enum(ctx,buf + 9,end,value_type,value,aggregate);
      return pcVar3;
    }
  }
  else if (uVar4 < 0x6e65675f656e756d) {
    if (((8 < (long)uVar2) && (uVar4 == 0x696e745f656e756d)) && (buf[8] == '.')) {
      pcVar3 = MyGame_Example_int_enum_parse_json_enum(ctx,buf + 9,end,value_type,value,aggregate);
      return pcVar3;
    }
  }
  else if (uVar4 == 0x6e6f74656d707479) {
    puVar1 = (ulong *)(buf + 8);
    uVar2 = (long)end - (long)puVar1;
    if (uVar2 < 8) {
      uVar4 = 0;
      switch(uVar2) {
      case 7:
        uVar4 = (long)buf[0xe] << 8;
      case 6:
        uVar4 = uVar4 | (long)buf[0xd] << 0x10;
      case 5:
        uVar4 = uVar4 | (long)buf[0xc] << 0x18;
      case 4:
        uVar4 = uVar4 | (long)buf[0xb] << 0x20;
      case 3:
        uVar4 = uVar4 | (long)buf[10] << 0x28;
      case 2:
        uVar4 = uVar4 | (long)buf[9] << 0x30;
      case 1:
        uVar4 = (ulong)(byte)*puVar1 << 0x38 | uVar4;
        break;
      default:
        goto switchD_0010d546_default;
      }
    }
    else {
      uVar4 = *puVar1;
      uVar4 = (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 |
              uVar4 << 0x38;
    }
    if (((4 < (long)uVar2) && ((uVar4 & 0xffffffff00000000) == 0x656e756d00000000)) &&
       (buf[0xc] == '.')) {
      pcVar3 = MyGame_Example_notemptyenum_parse_json_enum
                         (ctx,buf + 0xd,end,value_type,value,aggregate);
      return pcVar3;
    }
  }
  else if (((uVar4 == 0x6e65675f656e756d) && (8 < (long)uVar2)) && (buf[8] == '.')) {
    pcVar3 = MyGame_Example_neg_enum_parse_json_enum(ctx,buf + 9,end,value_type,value,aggregate);
    return pcVar3;
  }
switchD_0010d546_default:
  return buf;
}

Assistant:

static const char *monster_test_local_MyGame_Example_json_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_type, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x6865785f656e756d) { /* branch "hex_enum" */
        if (w < 0x436f6c6f72000000) { /* branch "Color" */
            if ((w & 0xffffff0000000000) == 0x416e790000000000) { /* "Any" */
                buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 3);
                if (buf != mark) {
                    buf = MyGame_Example_Any_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                } else {
                    return unmatched;
                }
            } else { /* "Any" */
                return unmatched;
            } /* "Any" */
        } else { /* branch "Color" */
            if ((w & 0xffffff0000000000) == 0x466f6f0000000000) { /* "Foo" */
                buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 3);
                if (buf != mark) {
                    buf = MyGame_Example_Foo_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                } else {
                    return unmatched;
                }
            } else { /* "Foo" */
                if ((w & 0xffffffffff000000) == 0x436f6c6f72000000) { /* "Color" */
                    buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 5);
                    if (buf != mark) {
                        buf = MyGame_Example_Color_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                    } else {
                        return unmatched;
                    }
                } else { /* "Color" */
                    return unmatched;
                } /* "Color" */
            } /* "Foo" */
        } /* branch "Color" */
    } else { /* branch "hex_enum" */
        if (w < 0x696e745f656e756d) { /* branch "int_enum" */
            if (w == 0x6865785f656e756d) { /* "hex_enum" */
                buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 8);
                if (buf != mark) {
                    buf = MyGame_Example_hex_enum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                } else {
                    return unmatched;
                }
            } else { /* "hex_enum" */
                return unmatched;
            } /* "hex_enum" */
        } else { /* branch "int_enum" */
            if (w < 0x6e65675f656e756d) { /* branch "neg_enum" */
                if (w == 0x696e745f656e756d) { /* "int_enum" */
                    buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 8);
                    if (buf != mark) {
                        buf = MyGame_Example_int_enum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                    } else {
                        return unmatched;
                    }
                } else { /* "int_enum" */
                    return unmatched;
                } /* "int_enum" */
            } else { /* branch "neg_enum" */
                if (w == 0x6e65675f656e756d) { /* "neg_enum" */
                    buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 8);
                    if (buf != mark) {
                        buf = MyGame_Example_neg_enum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                    } else {
                        goto pfguard1;
                    }
                } else { /* "neg_enum" */
                    goto pfguard1;
                } /* "neg_enum" */
                goto endpfguard1;
pfguard1:
                if (w == 0x6e6f74656d707479) { /* descend "notempty" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffffffff00000000) == 0x656e756d00000000) { /* "enum" */
                        buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 4);
                        if (buf != mark) {
                            buf = MyGame_Example_notemptyenum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                        } else {
                            return unmatched;
                        }
                    } else { /* "enum" */
                        return unmatched;
                    } /* "enum" */
                } else { /* descend "notempty" */
                    return unmatched;
                } /* descend "notempty" */
endpfguard1:
                (void)0;
            } /* branch "neg_enum" */
        } /* branch "int_enum" */
    } /* branch "hex_enum" */
    return buf;
}